

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffTable(NodeDiffComputer *this,TableDecl *lhs,TableDecl *rhs)

{
  size_type_conflict sVar1;
  TableMember *pTVar2;
  TableMember *pTVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  ulong uVar7;
  int32_t iVar8;
  int iVar9;
  long lVar10;
  
  sVar1 = (lhs->_members)._size;
  iVar4 = sVar1 - (rhs->_members)._size;
  if (iVar4 == 0) {
    if (sVar1 == 0) {
      iVar8 = 0;
    }
    else {
      uVar7 = 0;
      lVar10 = 0x10;
      iVar8 = 0;
      do {
        pTVar2 = (lhs->_members)._vals;
        pTVar3 = (rhs->_members)._vals;
        iVar5 = diffNodes(this,*(Node **)((long)pTVar2 + lVar10 + -0x10),
                          *(Node **)((long)pTVar3 + lVar10 + -0x10));
        if (this->limit < iVar5) {
          return iVar5;
        }
        iVar6 = diffNodes(this,*(Node **)((long)pTVar2 + lVar10 + -8),
                          *(Node **)((long)pTVar3 + lVar10 + -8));
        if (this->limit < iVar6) {
          return iVar6;
        }
        iVar4 = 0;
        if (((*(byte *)((long)&pTVar2->key + lVar10) ^ *(byte *)((long)&pTVar3->key + lVar10)) & 1)
            != 0) {
          iVar4 = (this->DiffCosts).StaticMemberDiffCost;
        }
        iVar8 = iVar8 + iVar5 + iVar6 + iVar4;
        uVar7 = uVar7 + 1;
        lVar10 = lVar10 + 0x18;
      } while (uVar7 < (lhs->_members)._size);
    }
  }
  else {
    iVar9 = -iVar4;
    if (0 < iVar4) {
      iVar9 = iVar4;
    }
    iVar8 = iVar9 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar8;
}

Assistant:

int32_t diffTable(const TableDecl *lhs, const TableDecl *rhs) {
    const auto &leftMembers = lhs->members();
    const auto &rightMembers = rhs->members();

    if (leftMembers.size() != rightMembers.size())
      return sizeDiff(leftMembers.size(), rightMembers.size());

    int32_t tableDiff = 0;

    for (int32_t i = 0; i < leftMembers.size(); ++i) {
      const auto &l = leftMembers[i];
      const auto &r = rightMembers[i];

      int32_t keyDiff = diffNodes(l.key, r.key);

      if (keyDiff > limit)
        return keyDiff;

      int32_t valueDiff = diffNodes(l.value, r.value);

      if (valueDiff > limit)
        return valueDiff;

      tableDiff += (keyDiff + valueDiff);

      if (l.isStatic() != r.isStatic())
        tableDiff += DiffCosts.StaticMemberDiffCost;
    }

    return tableDiff;
  }